

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O2

void __thiscall Lodtalk::NativeError::~NativeError(NativeError *this)

{
  this->super_NativeException = (NativeException)&PTR__NativeError_00170b08;
  std::__cxx11::string::~string((string *)&this->errorMessage);
  std::exception::~exception((exception *)this);
  return;
}

Assistant:

class LODTALK_VM_EXPORT NativeError: public NativeException
{
public:
	NativeError(const std::string &errorMessage) noexcept
		: errorMessage(errorMessage) {}

	virtual const char* what() const noexcept
	{
		return errorMessage.c_str();
	}

private:
	std::string errorMessage;
}